

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::emplace_back<slang::ast::LValue::BitSlice>
          (SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           *this,BitSlice *args)

{
  size_type sVar1;
  ulong uVar2;
  variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *__result;
  reference __result_00;
  ulong uVar3;
  move_iterator<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_*>
  __last;
  move_iterator<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_*>
  __last_00;
  move_iterator<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_*>
  __first;
  long lVar4;
  
  __last._M_current = this->data_ + this->len;
  if (this->len != this->cap) {
    *(ConstantRange *)
     &((__last._M_current)->
      super__Variant_base<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      ).
      super__Move_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      .
      super__Copy_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      .
      super__Move_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      .
      super__Copy_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      .
      super__Variant_storage_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      ._M_u = args->range;
    ((__last._M_current)->
    super__Variant_base<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
    ).
    super__Move_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
    .
    super__Copy_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
    .
    super__Move_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
    .
    super__Copy_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
    .
    super__Variant_storage_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
    ._M_index = '\0';
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len == 0x1745d1745d1745d) {
    detail::throwLengthError();
  }
  uVar3 = this->len + 1;
  uVar2 = this->cap;
  if (uVar3 < uVar2 * 2) {
    uVar3 = uVar2 * 2;
  }
  if (0x1745d1745d1745d - uVar2 < uVar2) {
    uVar3 = 0x1745d1745d1745d;
  }
  lVar4 = (long)__last._M_current - (long)this->data_;
  __result = (variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
              *)operator_new(uVar3 * 0x58);
  *(ConstantRange *)((long)__result + lVar4) = args->range;
  *(undefined1 *)((long)__result + lVar4 + 0x50) = 0;
  __first._M_current = this->data_;
  __last_00._M_current = __first._M_current + this->len;
  __result_00 = __result;
  if (__last_00._M_current != __last._M_current) {
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>,std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>
              (__first,__last,__result);
    __last_00._M_current = this->data_ + this->len;
    __result_00 = (reference)((long)__result + lVar4) + 1;
    __first._M_current = __last._M_current;
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>,std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>
            (__first,__last_00,__result_00);
  cleanup(this,(EVP_PKEY_CTX *)__last_00._M_current);
  this->len = this->len + 1;
  this->cap = uVar3;
  this->data_ = __result;
  return (reference)((long)__result + lVar4);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }